

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id3.c
# Opt level: O1

int id3_fill_header(uchar *buf,uint len,unsigned_long id3_size)

{
  int iVar1;
  unsigned_long res;
  ulong uVar2;
  long lVar3;
  unsigned_long uVar4;
  
  if (buf == (uchar *)0x0) {
    __assert_fail("buf != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",0x5c,
                  "int id3_fill_header(unsigned char *, unsigned int, unsigned long)");
  }
  if (len != 0) {
    iVar1 = 0;
    if (9 < len) {
      builtin_memcpy(buf,"ID3\x02",5);
      buf[5] = '\0';
      lVar3 = 0;
      uVar2 = 0;
      uVar4 = id3_size;
      do {
        uVar2 = uVar2 | (ulong)((uint)uVar4 & 0x7f) << ((byte)lVar3 & 0x3f);
        uVar4 = uVar4 >> 7;
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x20);
      buf[6] = (uchar)(uVar2 >> 0x18);
      lVar3 = 0;
      uVar2 = 0;
      uVar4 = id3_size;
      do {
        uVar2 = uVar2 | (ulong)((uint)uVar4 & 0x7f) << ((byte)lVar3 & 0x3f);
        uVar4 = uVar4 >> 7;
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x20);
      buf[7] = (uchar)(uVar2 >> 0x10);
      lVar3 = 0;
      uVar2 = 0;
      uVar4 = id3_size;
      do {
        uVar2 = uVar2 | (ulong)((uint)uVar4 & 0x7f) << ((byte)lVar3 & 0x3f);
        uVar4 = uVar4 >> 7;
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x20);
      buf[8] = (uchar)(uVar2 >> 8);
      lVar3 = 0;
      uVar2 = 0;
      do {
        uVar2 = uVar2 | (ulong)((uint)id3_size & 0x7f) << ((byte)lVar3 & 0x3f);
        id3_size = id3_size >> 7;
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x20);
      buf[9] = (uchar)uVar2;
      iVar1 = 10;
    }
    return iVar1;
  }
  __assert_fail("len > 0","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",0x5d
                ,"int id3_fill_header(unsigned char *, unsigned int, unsigned long)");
}

Assistant:

int id3_fill_header(unsigned char *buf, unsigned int len,
                    unsigned long id3_size) {
  assert(buf != NULL);
  assert(len > 0);
  if (len < 10)
    return 0;

  unsigned char *ptr = buf;
  memcpy(ptr, "ID3", 3); ptr += 3;
  UINT8_PACK(ptr, 0x02); UINT8_PACK(ptr, 0x00); /* version 2.0 */
  UINT8_PACK(ptr, 0x00);
  UINT32_PACK(ptr, id3_sync_safe(id3_size));
  return 10;
}